

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O0

SyncInfo __thiscall
vkt::synchronization::anon_unknown_0::CopyBlitImage::ImplementationBase::getSyncInfo
          (ImplementationBase *this)

{
  SyncInfo SVar1;
  VkImageLayout layout;
  VkAccessFlags access;
  ImplementationBase *this_local;
  SyncInfo syncInfo;
  
  SVar1.accessMask = (uint)(this->m_mode != ACCESS_MODE_READ) * 0x800 + 0x800;
  SVar1.stageMask = 0x1000;
  SVar1.imageLayout = VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL - (this->m_mode == ACCESS_MODE_READ);
  return SVar1;
}

Assistant:

SyncInfo getSyncInfo (void) const
	{
		const VkAccessFlags access		= (m_mode == ACCESS_MODE_READ ? VK_ACCESS_TRANSFER_READ_BIT : VK_ACCESS_TRANSFER_WRITE_BIT);
		const VkImageLayout layout		= (m_mode == ACCESS_MODE_READ ? VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL : VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL);
		const SyncInfo		syncInfo	=
		{
			VK_PIPELINE_STAGE_TRANSFER_BIT,		// VkPipelineStageFlags		stageMask;
			access,								// VkAccessFlags			accessMask;
			layout,								// VkImageLayout			imageLayout;
		};
		return syncInfo;
	}